

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgkyj(fitsfile *fptr,char *keyname,long *value,char *comm,int *status)

{
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  char valstring [71];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_R8 < 1) {
    ffgkey((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
           in_RDX,in_RCX);
    ffc2i((char *)fptr,(long *)keyname,(int *)value);
    iVar1 = *in_R8;
  }
  else {
    iVar1 = *in_R8;
  }
  return iVar1;
}

Assistant:

int ffgkyj( fitsfile *fptr,     /* I - FITS file pointer         */
            const char *keyname,      /* I - name of keyword to read   */
            long *value,        /* O - keyword value             */
            char *comm,         /* O - keyword comment           */
            int  *status)       /* IO - error status             */
/*
  Read (get) the named keyword, returning the value and comment.
  The value will be implicitly converted to a (long) integer if it not
  already of this datatype.  The comment may be up to 69 characters long.
*/
{
    char valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    ffgkey(fptr, keyname, valstring, comm, status);  /* read the keyword */
    ffc2i(valstring, value, status);   /* convert string to value */

    return(*status);
}